

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

JSON * chaiscript::json::JSONParser::parse_string
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  JSON *pJVar1;
  byte bVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  ulong uVar6;
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  JSON *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  size_type *local_90;
  size_type local_88;
  size_type local_80;
  undefined8 uStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  uVar6 = *offset + 1;
  *offset = uVar6;
  local_b8 = __return_storage_ptr__;
  if (uVar6 < str->_M_string_length) {
    do {
      bVar2 = (str->_M_dataplus)._M_p[uVar6];
      if (bVar2 != 0x5c) {
        if (bVar2 == 0x22) {
          *offset = *offset + 1;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_d8._M_dataplus._M_p,
                     local_d8._M_dataplus._M_p + local_d8._M_string_length);
          pJVar1 = local_b8;
          JSON::JSON<std::__cxx11::string>(local_b8,&local_b0,(type *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,
                            CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                     local_d8.field_2._M_local_buf[0]) + 1);
          }
          return pJVar1;
        }
        goto LAB_00313467;
      }
      uVar6 = *offset + 1;
      *offset = uVar6;
      if (str->_M_string_length <= uVar6) break;
      bVar2 = (str->_M_dataplus)._M_p[uVar6];
      if (bVar2 < 0x62) {
        if (((bVar2 != 0x22) && (bVar2 != 0x2f)) && (bVar2 != 0x5c)) goto switchD_003134cd_caseD_6f;
        goto LAB_00313467;
      }
      switch(bVar2) {
      case 0x6e:
        bVar2 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_003134cd_caseD_6f:
        bVar2 = 0x5c;
        break;
      case 0x72:
        bVar2 = 0xd;
        break;
      case 0x74:
        bVar2 = 9;
        break;
      case 0x75:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_d8,"\\u");
        lVar5 = 1;
        do {
          if (str->_M_string_length <= lVar5 + *offset) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          }
          bVar2 = (str->_M_dataplus)._M_p[lVar5 + *offset];
          if ((9 < (byte)(bVar2 - 0x30)) &&
             ((0x25 < bVar2 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0)))
             ) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,
                       "JSON ERROR: String: Expected hex character in unicode escape, found \'","");
            std::operator+(&local_50,&local_70,bVar2);
            pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_50,"\'");
            local_90 = (size_type *)(pbVar3->_M_dataplus)._M_p;
            paVar4 = &pbVar3->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90 == paVar4) {
              local_80 = paVar4->_M_allocated_capacity;
              uStack_78 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
              local_90 = &local_80;
            }
            else {
              local_80 = paVar4->_M_allocated_capacity;
            }
            local_88 = pbVar3->_M_string_length;
            (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
            pbVar3->_M_string_length = 0;
            (pbVar3->field_2)._M_local_buf[0] = '\0';
            std::runtime_error::runtime_error(this,(string *)&local_90);
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_d8,bVar2);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 5);
        *offset = *offset + 4;
        goto LAB_00313472;
      default:
        if (bVar2 == 0x62) {
          bVar2 = 8;
        }
        else {
          if (bVar2 != 0x66) goto switchD_003134cd_caseD_6f;
          bVar2 = 0xc;
        }
      }
LAB_00313467:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_d8,bVar2);
LAB_00313472:
      uVar6 = *offset + 1;
      *offset = uVar6;
    } while (uVar6 < str->_M_string_length);
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

static JSON parse_string(const std::string &str, size_t &offset) {
      std::string val;
      for (char c = str.at(++offset); c != '\"'; c = str.at(++offset)) {
        if (c == '\\') {
          switch (str.at(++offset)) {
            case '\"':
              val += '\"';
              break;
            case '\\':
              val += '\\';
              break;
            case '/':
              val += '/';
              break;
            case 'b':
              val += '\b';
              break;
            case 'f':
              val += '\f';
              break;
            case 'n':
              val += '\n';
              break;
            case 'r':
              val += '\r';
              break;
            case 't':
              val += '\t';
              break;
            case 'u': {
              val += "\\u";
              for (size_t i = 1; i <= 4; ++i) {
                c = str.at(offset + i);
                if ((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')) {
                  val += c;
                } else {
                  throw std::runtime_error(
                      std::string("JSON ERROR: String: Expected hex character in unicode escape, found '") + c + "'");
                }
              }
              offset += 4;
            } break;
            default:
              val += '\\';
              break;
          }
        } else {
          val += c;
        }
      }
      ++offset;
      return JSON(val);
    }